

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void __thiscall testing::internal::PrintTo(internal *this,__uint128_t v,ostream *os)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ostream *in_RDX;
  ulong uVar3;
  char digit;
  uint64_t carry;
  uint64_t high_mod;
  uint64_t low;
  uint64_t high;
  char *p;
  char buf [40];
  ostream *os_local;
  __uint128_t v_local;
  
  if (this == (internal *)0x0 && os == (ostream *)0x0) {
    std::operator<<(in_RDX,"0");
  }
  else {
    buf[0x1f] = '\0';
    low = (uint64_t)os;
    high = (uint64_t)(buf + 0x1f);
    for (high_mod = (uint64_t)this; low != 0 || high_mod != 0;
        high_mod = high_mod / 10 + uVar3 * 0x1999999999999999 + uVar2 / 10) {
      uVar3 = low % 10;
      low = low / 10;
      uVar2 = uVar3 * 6 + high_mod % 10;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar2;
      *(char *)(high - 1) = SUB161(auVar1 % ZEXT816(10),0) + '0';
      high = high - 1;
    }
    std::operator<<(in_RDX,(char *)high);
  }
  return;
}

Assistant:

void PrintTo(__uint128_t v, ::std::ostream* os) {
  if (v == 0) {
    *os << "0";
    return;
  }

  // Buffer large enough for ceil(log10(2^128))==39 and the null terminator
  char buf[40];
  char* p = buf + sizeof(buf);

  // Some configurations have a __uint128_t, but no support for built in
  // division. Do manual long division instead.

  uint64_t high = static_cast<uint64_t>(v >> 64);
  uint64_t low = static_cast<uint64_t>(v);

  *--p = 0;
  while (high != 0 || low != 0) {
    uint64_t high_mod = high % 10;
    high = high / 10;
    // This is the long division algorithm specialized for a divisor of 10 and
    // only two elements.
    // Notable values:
    //   2^64 / 10 == 1844674407370955161
    //   2^64 % 10 == 6
    const uint64_t carry = 6 * high_mod + low % 10;
    low = low / 10 + high_mod * 1844674407370955161 + carry / 10;

    char digit = static_cast<char>(carry % 10);
    *--p = static_cast<char>('0' + digit);
  }
  *os << p;
}